

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3PoslistPhraseMerge(char **pp,int nToken,int isSaveLeft,int isExact,char **pp1,char **pp2)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  char *pEnd;
  long lVar9;
  char *pEnd_2;
  byte *pbVar10;
  long lVar11;
  uchar *q;
  byte *pbVar12;
  byte *pbVar13;
  char *pEnd_3;
  byte *pBuf;
  char *pEnd_1;
  long lVar14;
  int iCol1;
  int iCol2;
  sqlite3_int64 iVal;
  int local_78;
  int local_74;
  byte *local_70;
  long local_68;
  int local_60;
  int local_5c;
  char **local_58;
  long local_50;
  long local_48;
  char **local_40;
  char **local_38;
  
  local_70 = (byte *)*pp;
  pbVar10 = (byte *)*pp1;
  pBuf = (byte *)*pp2;
  local_78 = 0;
  local_74 = 0;
  local_60 = isSaveLeft;
  local_5c = isExact;
  if (*pbVar10 == 1) {
    if ((char)pbVar10[1] < '\0') {
      uVar4 = sqlite3Fts3GetVarint32((char *)(pbVar10 + 1),&local_78);
      uVar6 = (ulong)uVar4;
    }
    else {
      uVar6 = 1;
      local_78 = (int)(char)pbVar10[1];
    }
    pbVar10 = pbVar10 + 1 + uVar6;
  }
  local_40 = pp1;
  local_38 = pp2;
  if (*pBuf == 1) {
    if ((char)pBuf[1] < '\0') {
      uVar4 = sqlite3Fts3GetVarint32((char *)(pBuf + 1),&local_74);
      uVar6 = (ulong)uVar4;
    }
    else {
      uVar6 = 1;
      local_74 = (int)(char)pBuf[1];
    }
    pBuf = pBuf + 1 + uVar6;
  }
  local_48 = (long)nToken;
  do {
    iVar5 = local_78;
    while (pbVar12 = local_70, iVar5 != local_74) {
      if (iVar5 < local_74) {
        bVar2 = *pbVar10;
        if (1 < bVar2) {
          do {
            bVar3 = bVar2 & 0x80;
            bVar2 = pbVar10[1];
            pbVar10 = pbVar10 + 1;
          } while ((bVar2 & 0xfe) != 0 || bVar3 != 0);
        }
        if (*pbVar10 == 0) goto LAB_001beba3;
        if ((char)pbVar10[1] < '\0') {
          uVar4 = sqlite3Fts3GetVarint32((char *)(pbVar10 + 1),&local_78);
          uVar6 = (ulong)uVar4;
        }
        else {
          uVar6 = 1;
          local_78 = (int)(char)pbVar10[1];
        }
        pbVar10 = pbVar10 + 1 + uVar6;
        iVar5 = local_78;
      }
      else {
        bVar2 = *pBuf;
        if (1 < bVar2) {
          do {
            bVar3 = bVar2 & 0x80;
            bVar2 = pBuf[1];
            pBuf = pBuf + 1;
          } while ((bVar2 & 0xfe) != 0 || bVar3 != 0);
        }
        if (*pBuf == 0) goto LAB_001beba3;
        if ((char)pBuf[1] < '\0') {
          uVar4 = sqlite3Fts3GetVarint32((char *)(pBuf + 1),&local_74);
          uVar6 = (ulong)uVar4;
        }
        else {
          uVar6 = 1;
          local_74 = (int)(char)pBuf[1];
        }
        pBuf = pBuf + 1 + uVar6;
      }
    }
    if (iVar5 != 0) {
      *local_70 = 1;
      uVar6 = (long)local_78;
      pbVar12 = local_70 + 1;
      do {
        pbVar13 = pbVar12;
        bVar2 = (byte)uVar6;
        *pbVar13 = bVar2 | 0x80;
        pbVar12 = pbVar13 + 1;
        bVar1 = 0x7f < uVar6;
        uVar6 = uVar6 >> 7;
      } while (bVar1);
      *pbVar13 = bVar2;
    }
    iVar5 = sqlite3Fts3GetVarint((char *)pbVar10,&local_68);
    lVar11 = local_68;
    pbVar10 = pbVar10 + iVar5;
    iVar5 = sqlite3Fts3GetVarint((char *)pBuf,&local_68);
    pBuf = pBuf + iVar5;
    if (local_68 < 2 || lVar11 < 2) {
LAB_001beb4a:
      bVar1 = false;
    }
    else {
      lVar9 = local_68 + -2;
      lVar7 = 0;
      local_58 = pp;
      while( true ) {
        local_50 = lVar11 + -2;
        lVar11 = local_50 + local_48;
        while( true ) {
          pp = local_58;
          if ((lVar9 == lVar11) || (((lVar9 <= lVar11 && (local_5c == 0)) && (local_50 < lVar9)))) {
            lVar14 = local_50;
            if (local_60 == 0) {
              lVar14 = lVar9;
            }
            uVar6 = (lVar14 - lVar7) + 2;
            do {
              pbVar13 = pbVar12;
              bVar2 = (byte)uVar6;
              *pbVar13 = bVar2 | 0x80;
              pbVar12 = pbVar13 + 1;
              bVar1 = 0x7f < uVar6;
              uVar6 = uVar6 >> 7;
            } while (bVar1);
            *pbVar13 = bVar2;
            local_70 = (byte *)0x0;
            lVar7 = lVar14;
          }
          if ((local_50 < lVar9) && (local_60 != 0 || lVar11 < lVar9)) break;
          if (*pBuf < 2) goto LAB_001bead0;
          iVar5 = sqlite3Fts3GetVarint((char *)pBuf,&local_68);
          pBuf = pBuf + iVar5;
          lVar9 = lVar9 + local_68 + -2;
        }
        if (*pbVar10 < 2) break;
        iVar5 = sqlite3Fts3GetVarint((char *)pbVar10,&local_68);
        pbVar10 = pbVar10 + iVar5;
        lVar11 = local_50 + local_68;
      }
LAB_001bead0:
      if (local_70 != (byte *)0x0) {
        pbVar12 = local_70;
      }
      bVar2 = *pbVar10;
      if (1 < bVar2) {
        do {
          bVar3 = bVar2 & 0x80;
          bVar2 = pbVar10[1];
          pbVar10 = pbVar10 + 1;
        } while ((bVar2 & 0xfe) != 0 || bVar3 != 0);
      }
      bVar2 = *pBuf;
      if (1 < bVar2) {
        do {
          bVar3 = bVar2 & 0x80;
          bVar2 = pBuf[1];
          pBuf = pBuf + 1;
        } while ((bVar2 & 0xfe) != 0 || bVar3 != 0);
      }
      if ((*pbVar10 == 0) || (*pBuf == 0)) goto LAB_001beb4a;
      if ((char)pbVar10[1] < '\0') {
        uVar4 = sqlite3Fts3GetVarint32((char *)(pbVar10 + 1),&local_78);
        uVar6 = (ulong)uVar4;
      }
      else {
        uVar6 = 1;
        local_78 = (int)(char)pbVar10[1];
      }
      if ((char)pBuf[1] < '\0') {
        uVar4 = sqlite3Fts3GetVarint32((char *)(pBuf + 1),&local_74);
        uVar8 = (ulong)uVar4;
      }
      else {
        uVar8 = 1;
        local_74 = (int)(char)pBuf[1];
      }
      pbVar10 = pbVar10 + 1 + uVar6;
      pBuf = pBuf + 1 + uVar8;
      bVar1 = true;
    }
    local_70 = pbVar12;
    if (!bVar1) {
LAB_001beba3:
      bVar2 = *pBuf;
      if (*pBuf != 0) {
        do {
          pbVar13 = pBuf + 1;
          pBuf = pBuf + 1;
          bVar3 = bVar2 & 0x80;
          bVar2 = *pbVar13;
        } while (bVar3 != 0 || *pbVar13 != 0);
      }
      bVar2 = *pbVar10;
      if (*pbVar10 != 0) {
        do {
          pbVar13 = pbVar10 + 1;
          pbVar10 = pbVar10 + 1;
          bVar3 = bVar2 & 0x80;
          bVar2 = *pbVar13;
        } while (bVar3 != 0 || *pbVar13 != 0);
      }
      *local_40 = (char *)(pbVar10 + 1);
      *local_38 = (char *)(pBuf + 1);
      pbVar10 = (byte *)*pp;
      if (pbVar10 != pbVar12) {
        *pbVar12 = 0;
        *pp = (char *)(pbVar12 + 1);
      }
      return (uint)(pbVar10 != pbVar12);
    }
  } while( true );
}

Assistant:

static int fts3PoslistPhraseMerge(
  char **pp,                      /* IN/OUT: Preallocated output buffer */
  int nToken,                     /* Maximum difference in token positions */
  int isSaveLeft,                 /* Save the left position */
  int isExact,                    /* If *pp1 is exactly nTokens before *pp2 */
  char **pp1,                     /* IN/OUT: Left input list */
  char **pp2                      /* IN/OUT: Right input list */
){
  char *p = *pp;
  char *p1 = *pp1;
  char *p2 = *pp2;
  int iCol1 = 0;
  int iCol2 = 0;

  /* Never set both isSaveLeft and isExact for the same invocation. */
  assert( isSaveLeft==0 || isExact==0 );

  assert( p!=0 && *p1!=0 && *p2!=0 );
  if( *p1==POS_COLUMN ){ 
    p1++;
    p1 += fts3GetVarint32(p1, &iCol1);
  }
  if( *p2==POS_COLUMN ){ 
    p2++;
    p2 += fts3GetVarint32(p2, &iCol2);
  }

  while( 1 ){
    if( iCol1==iCol2 ){
      char *pSave = p;
      sqlite3_int64 iPrev = 0;
      sqlite3_int64 iPos1 = 0;
      sqlite3_int64 iPos2 = 0;

      if( iCol1 ){
        *p++ = POS_COLUMN;
        p += sqlite3Fts3PutVarint(p, iCol1);
      }

      fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
      fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;
      if( iPos1<0 || iPos2<0 ) break;

      while( 1 ){
        if( iPos2==iPos1+nToken 
         || (isExact==0 && iPos2>iPos1 && iPos2<=iPos1+nToken) 
        ){
          sqlite3_int64 iSave;
          iSave = isSaveLeft ? iPos1 : iPos2;
          fts3PutDeltaVarint(&p, &iPrev, iSave+2); iPrev -= 2;
          pSave = 0;
          assert( p );
        }
        if( (!isSaveLeft && iPos2<=(iPos1+nToken)) || iPos2<=iPos1 ){
          if( (*p2&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;
        }else{
          if( (*p1&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
        }
      }

      if( pSave ){
        assert( pp && p );
        p = pSave;
      }

      fts3ColumnlistCopy(0, &p1);
      fts3ColumnlistCopy(0, &p2);
      assert( (*p1&0xFE)==0 && (*p2&0xFE)==0 );
      if( 0==*p1 || 0==*p2 ) break;

      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }

    /* Advance pointer p1 or p2 (whichever corresponds to the smaller of
    ** iCol1 and iCol2) so that it points to either the 0x00 that marks the
    ** end of the position list, or the 0x01 that precedes the next 
    ** column-number in the position list. 
    */
    else if( iCol1<iCol2 ){
      fts3ColumnlistCopy(0, &p1);
      if( 0==*p1 ) break;
      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
    }else{
      fts3ColumnlistCopy(0, &p2);
      if( 0==*p2 ) break;
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }
  }

  fts3PoslistCopy(0, &p2);
  fts3PoslistCopy(0, &p1);
  *pp1 = p1;
  *pp2 = p2;
  if( *pp==p ){
    return 0;
  }
  *p++ = 0x00;
  *pp = p;
  return 1;
}